

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O0

bool __thiscall
CServerBrowserFavorites::RemoveFavoriteEx
          (CServerBrowserFavorites *this,char *pHostname,NETADDR *pAddr)

{
  long lVar1;
  CFavoriteServer *pCVar2;
  CServerBrowserFavorites *in_RDX;
  CServerBrowserFavorites *in_RDI;
  long in_FS_OFFSET;
  CFavoriteServer *pFavEntry;
  bool Result;
  int Index;
  int in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  byte bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = 0;
  pCVar2 = FindFavoriteByHostname
                     (in_RDX,(char *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if ((pCVar2 == (CFavoriteServer *)0x0) && (in_RDX != (CServerBrowserFavorites *)0x0)) {
    pCVar2 = FindFavoriteByAddr(in_RDX,(NETADDR *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                                (int *)0x0);
  }
  if (pCVar2 != (CFavoriteServer *)0x0) {
    if (pCVar2->m_State < 3) {
      if ((pCVar2->m_State < 2) && ((in_RDI->m_FavLookup).m_FavoriteIndex == 0)) {
        (in_RDI->m_FavLookup).m_FavoriteIndex = -1;
      }
    }
    else {
      bVar3 = 1;
    }
    RemoveFavoriteEntry(in_RDI,in_stack_ffffffffffffffbc);
    if (0 < (in_RDI->m_FavLookup).m_FavoriteIndex) {
      (in_RDI->m_FavLookup).m_FavoriteIndex = (in_RDI->m_FavLookup).m_FavoriteIndex + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool CServerBrowserFavorites::RemoveFavoriteEx(const char *pHostname, const NETADDR *pAddr)
{
	bool Result = false;

	// find favorite entry
	int Index = 0;
	CFavoriteServer *pFavEntry = FindFavoriteByHostname(pHostname, &Index);
	if(pFavEntry == 0 && pAddr)
		pFavEntry = FindFavoriteByAddr(*pAddr, &Index);
	if(pFavEntry)
	{
		if(pFavEntry->m_State >= FAVSTATE_ADDR)
		{
			// invalidate favorite state for server entry
			Result = true;
		}
		else if(pFavEntry->m_State <= FAVSTATE_LOOKUPCHECK && m_FavLookup.m_FavoriteIndex == Index)
		{
			// skip result on favorite hostname lookup
			m_FavLookup.m_FavoriteIndex = -1;
		}

		// remove favorite
		RemoveFavoriteEntry(Index);
		if(m_FavLookup.m_FavoriteIndex > Index)
			--m_FavLookup.m_FavoriteIndex;
	}

	return Result;
}